

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

void __thiscall kj::Array<bool>::~Array(Array<bool> *this)

{
  bool *pbVar1;
  size_t sVar2;
  
  pbVar1 = this->ptr;
  if (pbVar1 != (bool *)0x0) {
    sVar2 = this->size_;
    this->ptr = (bool *)0x0;
    this->size_ = 0;
    (*(code *)**(undefined8 **)this->disposer)(this->disposer,pbVar1,1,sVar2,sVar2,0);
  }
  return;
}

Assistant:

inline ~Array() noexcept { dispose(); }